

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::rrc_dhl(SM83 *this)

{
  byte bVar1;
  unsigned_short *in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x46;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RRC (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_RAX);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  (this->field_0).field_1.f = (bVar1 & 1) << 4 | (bVar1 == 0) << 7 | (this->field_0).field_1.f & 0xf
  ;
  Bus::Write8(this->bus,(this->field_3).hl,bVar1 >> 1 | bVar1 << 7,true);
  return;
}

Assistant:

void SM83::rrc_dhl() {
    LTRACE("RRC (HL)");

    u8 reg = bus.Read8(hl);
    bool should_carry = reg & 0x1;
    u8 result = (reg >> 1) | (should_carry << 7);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(should_carry);

    bus.Write8(hl, result);
}